

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O0

EventSource __thiscall XMISong::FindNextDue(XMISong *this)

{
  uint uVar1;
  AutoNoteOff *pAVar2;
  uint local_30;
  uint local_2c;
  DWORD fake_delay;
  DWORD real_delay;
  XMISong *this_local;
  
  if (((this->CurrSong->Finished & 1U) == 0) ||
     (uVar1 = TArray<AutoNoteOff,_AutoNoteOff>::Size
                        (&(this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>), uVar1 != 0)) {
    if ((this->CurrSong->Finished & 1U) == 0) {
      local_2c = this->CurrSong->Delay;
    }
    else {
      local_2c = 0xffffffff;
    }
    uVar1 = TArray<AutoNoteOff,_AutoNoteOff>::Size
                      (&(this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>);
    if (uVar1 == 0) {
      local_30 = 0xffffffff;
    }
    else {
      pAVar2 = TArray<AutoNoteOff,_AutoNoteOff>::operator[]
                         (&(this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>,0);
      local_30 = pAVar2->Delay;
    }
    this_local._4_4_ = EVENT_Real;
    if (local_30 <= local_2c) {
      this_local._4_4_ = EVENT_Fake;
    }
  }
  else {
    this_local._4_4_ = EVENT_None;
  }
  return this_local._4_4_;
}

Assistant:

XMISong::EventSource XMISong::FindNextDue()
{
	// Are there still events available?
	if (CurrSong->Finished && NoteOffs.Size() == 0)
	{
		return EVENT_None;
	}

	// Which is due sooner? The current song or the note-offs?
	DWORD real_delay = CurrSong->Finished ? 0xFFFFFFFF : CurrSong->Delay;
	DWORD fake_delay = NoteOffs.Size() == 0 ? 0xFFFFFFFF : NoteOffs[0].Delay;

	return (fake_delay <= real_delay) ? EVENT_Fake : EVENT_Real;
}